

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureGather2DArrayCase::createInstance
          (TextureGather2DArrayCase *this,Context *context)

{
  GatherType gatherType;
  OffsetSize OVar1;
  VkPhysicalDeviceProperties *pVVar2;
  TextureGatherInstance *this_00;
  Context *__p;
  IVec3 *textureSize;
  TextureFormat *format;
  Gather2DArrayArgs *__cur;
  pointer __args;
  TextureFormat local_50;
  vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
  iterations;
  
  gatherType = (this->m_baseParams).gatherType;
  OVar1 = (this->m_baseParams).offsetSize;
  pVVar2 = Context::getDeviceProperties(context);
  if (OVar1 == OFFSETSIZE_NONE) {
    local_50.order = R;
    local_50.type = SNORM_INT8;
  }
  else if (OVar1 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    local_50.order = (pVVar2->limits).minTexelGatherOffset;
    local_50.type = (pVVar2->limits).maxTexelGatherOffset;
  }
  else if (OVar1 == OFFSETSIZE_MINIMUM_REQUIRED) {
    local_50.order = ~RGB;
    local_50.type = UNORM_BYTE_44;
  }
  else {
    local_50.order = ~R;
    local_50.type = ~SNORM_INT8;
  }
  textureSize = &this->m_textureSize;
  generate2DArrayCaseIterations
            (&iterations,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)&local_50,
             textureSize);
  this_00 = (TextureGatherInstance *)operator_new(0x2e0);
  TextureGatherInstance::TextureGatherInstance(this_00,context,&this->m_baseParams);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TextureGather2DArrayInstance_00c00b30;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&this_00->field_0x264,textureSize);
  *(undefined1 (*) [16])&this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context =
       (undefined1  [16])0x0;
  this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = (SparseContext *)0x0;
  __p = (Context *)
        std::
        _Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
        ::_M_allocate((_Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                       *)(((long)iterations.
                                 super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)iterations.
                                super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x28),
                      (size_t)textureSize);
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = __p;
  *(Context **)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = __p;
  this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = (SparseContext *)
                (((long)iterations.
                        super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)iterations.
                       super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                       ._M_impl.super__Vector_impl_data._M_start) + (long)__p);
  for (__args = iterations.
                super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __args != iterations.
                super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                ._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
    std::
    _Construct<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,vkt::sr::(anonymous_namespace)::Gather2DArrayArgs_const&>
              ((Gather2DArrayArgs *)__p,__args);
    __p = (Context *)&__p->m_allocator;
  }
  *(Context **)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = __p;
  format = &local_50;
  local_50.order = CHANNELORDER_LAST;
  local_50.type = CHANNELTYPE_LAST;
  tcu::Texture2DArray::Texture2DArray
            ((Texture2DArray *)
             &this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
              super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
              .m_data.field_0x8,format,1,1,1);
  TextureGatherInstance::init(this_00,(EVP_PKEY_CTX *)format);
  std::
  _Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
  ::~_Vector_base(&iterations.
                   super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                 );
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureGather2DArrayCase::createInstance (Context& context) const
{
	const vector<Gather2DArrayArgs>		iterations	= generate2DArrayCaseIterations(m_baseParams.gatherType,
																					m_baseParams.textureFormat,
																					getOffsetRange(m_baseParams.offsetSize, context.getDeviceProperties().limits),
																					m_textureSize);

	return new TextureGather2DArrayInstance(context, m_baseParams, m_textureSize, iterations);
}